

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void runtime::printConstantArray<double>(ostream *out,vector<double,_std::allocator<double>_> *vec)

{
  double *pdVar1;
  ostream *poVar2;
  double *val;
  double *pdVar3;
  
  pdVar1 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    poVar2 = std::operator<<(out,"| |");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"| ");
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}